

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# twolevel.c
# Opt level: O0

void miss_promote(VMEMcache *cache,void *key,size_t key_size,void *arg)

{
  int iVar1;
  long lVar2;
  void *__ptr;
  void *pvVar3;
  void *buf;
  size_t vsize;
  VMEMcache *colder;
  void *arg_local;
  size_t key_size_local;
  void *key_local;
  VMEMcache *cache_local;
  
  vsize = (size_t)arg;
  colder = (VMEMcache *)arg;
  arg_local = (void *)key_size;
  key_size_local = (size_t)key;
  key_local = cache;
  lVar2 = vmemcache_get(arg,key,key_size,0,0,0,&buf);
  if ((lVar2 == 0) && (__ptr = malloc((size_t)buf), __ptr != (void *)0x0)) {
    pvVar3 = (void *)vmemcache_get(vsize,key_size_local,arg_local,__ptr,buf,0,0);
    if ((pvVar3 == buf) &&
       (iVar1 = vmemcache_put(key_local,key_size_local,arg_local,__ptr,buf), iVar1 == 0)) {
      vmemcache_evict(vsize,key_size_local,arg_local);
    }
    free(__ptr);
  }
  return;
}

Assistant:

static void
miss_promote(VMEMcache *cache, const void *key, size_t key_size, void *arg)
{
	VMEMcache *colder = (VMEMcache *)arg;

	size_t vsize;
	if (vmemcache_get(colder, key, key_size, NULL, 0, 0, &vsize)) {
		/*
		 * Second-level cache miss.
		 *
		 * You may want to handle it somehow here.
		 */
		return;
	}
	void *buf = malloc(vsize);
	if (!buf)
		return;
	if (vmemcache_get(colder, key, key_size, buf, vsize, 0, NULL) ==
		(ssize_t)vsize) {
		/*
		 * Note that there's no lock, thus our entry may disappear
		 * between these two get() calls.
		 */
		if (!vmemcache_put(cache, key, key_size, buf, vsize)) {
			/*
			 * Put can legitimately fail: value too big for
			 * upper-level cache, no space because all evictable
			 * keys are busy, etc.
			 *
			 * The promotion likely cascades into one or more
			 * demotions to migrate cold keys downwards, to make
			 * space.
			 */
			/*
			 * You may or may not want to evict from cold cache
			 * here.
			 */
			vmemcache_evict(colder, key, key_size);
		}
	}
	free(buf);
}